

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O0

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  char *dir;
  double dVar6;
  string local_1428 [32];
  undefined1 local_1408 [8];
  ostringstream cmCTestLog_msg_7;
  string local_1290 [32];
  undefined1 local_1270 [8];
  ostringstream cmCTestLog_msg_6;
  double local_10f8;
  allocator local_10e9;
  string local_10e8;
  uint local_10c8;
  allocator local_10c1;
  string local_10c0;
  string local_10a0;
  allocator local_1079;
  string local_1078;
  allocator local_1051;
  string local_1050;
  allocator local_1029;
  string local_1028;
  string local_1008 [32];
  undefined1 local_fe8 [8];
  ostringstream cmCTestLog_msg_5;
  allocator local_e69;
  string local_e68;
  allocator local_e41;
  string local_e40;
  allocator local_e19;
  string local_e18;
  allocator local_df1;
  string local_df0;
  undefined1 local_dd0 [8];
  cmXMLWriter xml;
  undefined1 local_d80 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_c08 [8];
  cmGeneratedFileStream ofs;
  undefined1 local_9b8 [4];
  uint start_time_time;
  string start_time;
  undefined1 local_978 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_800 [8];
  cmGeneratedFileStream os;
  int res;
  int retVal;
  string output;
  double elapsed_time_start;
  undefined1 local_568 [8];
  ostringstream cmCTestLog_msg_2;
  allocator local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string buildDirectory;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCTestLog_msg_1;
  allocator local_201;
  string local_200;
  undefined1 local_1e0 [8];
  string cCommand;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestConfigureHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Configure project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x27,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)(cCommand.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"ConfigureCommand",&local_201);
  cmCTest::GetCTestConfiguration((string *)local_1e0,pcVar1,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
    poVar3 = std::operator<<((ostream *)local_380,
                             "Cannot find ConfigureCommand key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x2e,pcVar4,false);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
    goto LAB_004ef0d6;
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"BuildDirectory",&local_3e9);
  cmCTest::GetCTestConfiguration((string *)local_3c8,pcVar1,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    output.field_2._8_8_ = cmsys::SystemTools::GetTime();
    std::__cxx11::string::string((string *)&res);
    os._580_4_ = 0;
    os._576_4_ = 0;
    bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1270);
      poVar3 = std::operator<<((ostream *)local_1270,"Configure with command: ");
      poVar3 = std::operator<<(poVar3,(string *)local_1e0);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x71,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_1290);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1270);
LAB_004eef71:
      if ((os._576_4_ == 0) || (os._580_4_ != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1408);
        poVar3 = std::operator<<((ostream *)local_1408,"Error(s) when configuring the project");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x76,pcVar4,false);
        std::__cxx11::string::~string(local_1428);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1408);
        this_local._4_4_ = -1;
        buildDirectory.field_2._12_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
        buildDirectory.field_2._12_4_ = 1;
      }
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_800);
      bVar2 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_800);
      if (bVar2) {
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_9b8,(this->super_cmCTestGenericHandler).CTest);
        dVar6 = cmsys::SystemTools::GetTime();
        ofs._580_4_ = SUB84((long)dVar6,0);
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_c08);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_c08
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d80);
        poVar3 = std::operator<<((ostream *)local_d80,"Configure with command: ");
        poVar3 = std::operator<<(poVar3,(string *)local_1e0);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x50,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&xml.ElementOpen);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d80);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        dir = (char *)std::__cxx11::string::c_str();
        os._576_4_ = cmCTest::RunMakeCommand
                               (pcVar1,pcVar4,(string *)&res,(int *)&os.field_0x244,dir,0,
                                (ostream *)local_c08);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_c08 + (long)*(_func_int **)((long)local_c08 + -0x18)));
        if (bVar2) {
          std::ofstream::close();
        }
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(local_800 + (long)*(_func_int **)((long)local_800 + -0x18)));
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_dd0,(ostream *)local_800,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_dd0,
                            (bool)((this->super_cmCTestGenericHandler).AppendXML & 1));
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_df0,"Configure",&local_df1);
          cmXMLWriter::StartElement((cmXMLWriter *)local_dd0,&local_df0);
          std::__cxx11::string::~string((string *)&local_df0);
          std::allocator<char>::~allocator((allocator<char> *)&local_df1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e18,"StartDateTime",&local_e19);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_dd0,&local_e18,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b8)
          ;
          std::__cxx11::string::~string((string *)&local_e18);
          std::allocator<char>::~allocator((allocator<char> *)&local_e19);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e40,"StartConfigureTime",&local_e41);
          cmXMLWriter::Element<unsigned_int>
                    ((cmXMLWriter *)local_dd0,&local_e40,(uint *)&ofs.field_0x244);
          std::__cxx11::string::~string((string *)&local_e40);
          std::allocator<char>::~allocator((allocator<char> *)&local_e41);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e68,"ConfigureCommand",&local_e69);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_dd0,&local_e68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
          ;
          std::__cxx11::string::~string((string *)&local_e68);
          std::allocator<char>::~allocator((allocator<char> *)&local_e69);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fe8);
          poVar3 = std::operator<<((ostream *)local_fe8,"End");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x62,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1008);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fe8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1028,"Log",&local_1029);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_dd0,&local_1028,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res);
          std::__cxx11::string::~string((string *)&local_1028);
          std::allocator<char>::~allocator((allocator<char> *)&local_1029);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1050,"ConfigureStatus",&local_1051);
          cmXMLWriter::Element<int>((cmXMLWriter *)local_dd0,&local_1050,(int *)&os.field_0x244);
          std::__cxx11::string::~string((string *)&local_1050);
          std::allocator<char>::~allocator((allocator<char> *)&local_1051);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1078,"EndDateTime",&local_1079);
          cmCTest::CurrentTime_abi_cxx11_(&local_10a0,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::Element<std::__cxx11::string>
                    ((cmXMLWriter *)local_dd0,&local_1078,&local_10a0);
          std::__cxx11::string::~string((string *)&local_10a0);
          std::__cxx11::string::~string((string *)&local_1078);
          std::allocator<char>::~allocator((allocator<char> *)&local_1079);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_10c0,"EndConfigureTime",&local_10c1);
          dVar6 = cmsys::SystemTools::GetTime();
          local_10c8 = (uint)(long)dVar6;
          cmXMLWriter::Element<unsigned_int>((cmXMLWriter *)local_dd0,&local_10c0,&local_10c8);
          std::__cxx11::string::~string((string *)&local_10c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_10e8,"ElapsedMinutes",&local_10e9);
          dVar6 = cmsys::SystemTools::GetTime();
          local_10f8 = (double)(int)((dVar6 - (double)output.field_2._8_8_) / 6.0) / 10.0;
          cmXMLWriter::Element<double>((cmXMLWriter *)local_dd0,&local_10e8,&local_10f8);
          std::__cxx11::string::~string((string *)&local_10e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
          cmXMLWriter::EndElement((cmXMLWriter *)local_dd0);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_dd0);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_dd0);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_c08);
        std::__cxx11::string::~string((string *)local_9b8);
        buildDirectory.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_978);
        poVar3 = std::operator<<((ostream *)local_978,"Cannot open configure file");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x46,pcVar4,false);
        std::__cxx11::string::~string((string *)(start_time.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_978);
        this_local._4_4_ = 1;
        buildDirectory.field_2._12_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_800);
      if (buildDirectory.field_2._12_4_ == 0) goto LAB_004eef71;
    }
    std::__cxx11::string::~string((string *)&res);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_568);
    poVar3 = std::operator<<((ostream *)local_568,
                             "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x38,pcVar4,false);
    std::__cxx11::string::~string((string *)&elapsed_time_start);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_568);
    this_local._4_4_ = -1;
    buildDirectory.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_3c8);
LAB_004ef0d6:
  std::__cxx11::string::~string((string *)local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
    "Configure project" << std::endl, this->Quiet);
  std::string cCommand
    = this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  std::string buildDirectory
    = this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty())
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
      << std::endl);
    return -1;
    }

  double elapsed_time_start = cmSystemTools::GetTime();
  std::string output;
  int retVal = 0;
  int res = 0;
  if ( !this->CTest->GetShowOnly() )
    {
    cmGeneratedFileStream os;
    if(!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os))
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, "Cannot open configure file"
        << std::endl);
      return 1;
      }
    std::string start_time = this->CTest->CurrentTime();
    unsigned int start_time_time = static_cast<unsigned int>(
      cmSystemTools::GetTime());

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand.c_str(), output,
      &retVal, buildDirectory.c_str(),
      0, ofs);

    if ( ofs )
      {
      ofs.close();
      }

    if ( os )
      {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime",
        static_cast<unsigned int>(cmSystemTools::GetTime()));
      xml.Element("ElapsedMinutes", static_cast<int>(
        (cmSystemTools::GetTime() - elapsed_time_start)/6)/10.0);
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
      }
    }
  else
    {
    cmCTestOptionalLog(this->CTest, DEBUG,
      "Configure with command: " << cCommand << std::endl, this->Quiet);
    }
  if (! res || retVal )
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
      "Error(s) when configuring the project" << std::endl);
    return -1;
    }
  return 0;
}